

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verilogAST.cpp
# Opt level: O0

string * __thiscall
verilogAST::Declaration::toString_abi_cxx11_(string *__return_storage_ptr__,Declaration *this)

{
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Declaration *local_18;
  Declaration *this_local;
  
  local_18 = this;
  this_local = (Declaration *)__return_storage_ptr__;
  std::operator+(&local_58,&this->decl," ");
  variant_to_string<std::unique_ptr<verilogAST::Identifier,std::default_delete<verilogAST::Identifier>>,std::unique_ptr<verilogAST::Index,std::default_delete<verilogAST::Index>>,std::unique_ptr<verilogAST::Slice,std::default_delete<verilogAST::Slice>>,std::unique_ptr<verilogAST::Vector,std::default_delete<verilogAST::Vector>>>
            (&local_78,&this->value);
  std::operator+(&local_38,&local_58,&local_78);
  std::operator+(__return_storage_ptr__,&local_38,";");
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string Declaration::toString() {
  return decl + " " + variant_to_string(value) + ";";
}